

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
emplace<QWindowSystemInterface::TouchPoint_const&>
          (QGenericArrayOps<QWindowSystemInterface::TouchPoint> *this,qsizetype i,TouchPoint *args)

{
  TouchPoint **ppTVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  Data *pDVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 *puVar7;
  TouchPoint *pTVar8;
  TouchPoint *pTVar9;
  TouchPoint *pTVar10;
  long in_FS_OFFSET;
  bool bVar11;
  byte bVar12;
  Inserter local_f0;
  TouchPoint local_a0;
  long local_28;
  
  bVar12 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010eccd:
    puVar7 = &DAT_00116b18;
    pTVar8 = &local_a0;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pTVar8 = *puVar7;
      puVar7 = puVar7 + 1;
      pTVar8 = (TouchPoint *)&pTVar8->uniqueId;
    }
    pTVar8 = args;
    pTVar9 = &local_a0;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar5 = *(undefined4 *)&pTVar8->field_0x4;
      pTVar9->id = pTVar8->id;
      *(undefined4 *)&pTVar9->field_0x4 = uVar5;
      pTVar8 = (TouchPoint *)&pTVar8->uniqueId;
      pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
    }
    local_a0.velocity.v[1] = (args->velocity).v[1];
    local_a0.rawPositions.d.d = (args->rawPositions).d.d;
    local_a0.rawPositions.d.ptr = (args->rawPositions).d.ptr;
    local_a0.rawPositions.d.size = (args->rawPositions).d.size;
    if (&(local_a0.rawPositions.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_a0.rawPositions.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_a0.rawPositions.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar11 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size != 0;
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>,
               (uint)(i == 0 && bVar11),1,(TouchPoint **)0x0,
               (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0);
    if (i != 0 || !bVar11) {
      local_f0.sourceCopyConstruct = 0;
      local_f0.nSource = 0;
      local_f0.move = 0;
      local_f0.sourceCopyAssign = 0;
      local_f0.end = (TouchPoint *)0x0;
      local_f0.last = (TouchPoint *)0x0;
      local_f0.where = (TouchPoint *)0x0;
      local_f0.begin = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
      local_f0.size = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
      local_f0.data = &this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>;
      Inserter::insertOne(&local_f0,i,&local_a0);
      (local_f0.data)->ptr = local_f0.begin;
      (local_f0.data)->size = local_f0.size;
      if (&(local_a0.rawPositions.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.rawPositions.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_a0.rawPositions.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      goto LAB_0010ee03;
    }
    pTVar8 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
    pTVar9 = &local_a0;
    pTVar10 = pTVar8 + -1;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar5 = *(undefined4 *)&pTVar9->field_0x4;
      pTVar10->id = pTVar9->id;
      *(undefined4 *)&pTVar10->field_0x4 = uVar5;
      pTVar9 = (TouchPoint *)((long)pTVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      pTVar10 = (TouchPoint *)((long)pTVar10 + (ulong)bVar12 * -0x10 + 8);
    }
    pTVar8[-1].velocity.v[1] = local_a0.velocity.v[1];
    pTVar8[-1].rawPositions.d.d = local_a0.rawPositions.d.d;
    pTVar8[-1].rawPositions.d.ptr = local_a0.rawPositions.d.ptr;
    pTVar8[-1].rawPositions.d.size = local_a0.rawPositions.d.size;
LAB_0010ed7b:
    ppTVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
    *ppTVar1 = *ppTVar1 + -1;
  }
  else {
    if (((this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size != i) ||
       (pTVar8 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr,
       (pDVar3->super_QArrayData).alloc - i ==
       ((long)((long)pTVar8 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x1111111111111111)) {
      if ((i != 0) ||
         (pTVar8 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr,
         (TouchPoint *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pTVar8)) goto LAB_0010eccd;
      pTVar9 = args;
      pTVar10 = pTVar8 + -1;
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        uVar5 = *(undefined4 *)&pTVar9->field_0x4;
        pTVar10->id = pTVar9->id;
        *(undefined4 *)&pTVar10->field_0x4 = uVar5;
        pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
        pTVar10 = (TouchPoint *)&pTVar10->uniqueId;
      }
      pTVar8[-1].velocity.v[1] = (args->velocity).v[1];
      pDVar4 = (args->rawPositions).d.d;
      pTVar8[-1].rawPositions.d.d = pDVar4;
      pTVar8[-1].rawPositions.d.ptr = (args->rawPositions).d.ptr;
      pTVar8[-1].rawPositions.d.size = (args->rawPositions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0010ed7b;
    }
    pTVar8[i].velocity.v[1] = (args->velocity).v[1];
    pTVar9 = args;
    pTVar10 = pTVar8 + i;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar5 = *(undefined4 *)&pTVar9->field_0x4;
      pTVar10->id = pTVar9->id;
      *(undefined4 *)&pTVar10->field_0x4 = uVar5;
      pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
      pTVar10 = (TouchPoint *)&pTVar10->uniqueId;
    }
    pDVar4 = (args->rawPositions).d.d;
    pTVar8[i].rawPositions.d.d = pDVar4;
    pTVar8[i].rawPositions.d.ptr = (args->rawPositions).d.ptr;
    pTVar8[i].rawPositions.d.size = (args->rawPositions).d.size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pqVar2 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
  *pqVar2 = *pqVar2 + 1;
LAB_0010ee03:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }